

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_insert_common(lyd_node *parent,lyd_node **sibling,lyd_node *node,int invalidate)

{
  lys_node *plVar1;
  long lVar2;
  lyd_node *last;
  int iVar3;
  lys_node_list *plVar4;
  lys_module *module;
  bool bVar5;
  char *local_b8;
  char *local_a8;
  LYS_NODE local_94;
  byte local_8d;
  int stype;
  uint8_t pos;
  ly_set *plStack_88;
  int i;
  ly_set *llists;
  int local_78;
  int clrdflt;
  int isrpc;
  int invalid;
  lyd_node *next2;
  lyd_node *next1;
  lyd_node *ins;
  lyd_node *iter;
  lyd_node *start;
  lys_node *siter;
  lys_node *par2;
  lys_node *par1;
  lys_node *plStack_28;
  int invalidate_local;
  lyd_node *node_local;
  lyd_node **sibling_local;
  lyd_node *parent_local;
  
  clrdflt = 0;
  local_78 = 0;
  llists._4_4_ = 0;
  plStack_88 = (ly_set *)0x0;
  local_94 = LYS_OUTPUT|LYS_INPUT;
  par1._4_4_ = invalidate;
  plStack_28 = (lys_node *)node;
  node_local = (lyd_node *)sibling;
  sibling_local = (lyd_node **)parent;
  if ((parent == (lyd_node *)0x0) && (sibling == (lyd_node **)0x0)) {
    __assert_fail("parent || sibling",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x10df,
                  "int lyd_insert_common(struct lyd_node *, struct lyd_node **, struct lyd_node *, int)"
                 );
  }
  if (parent == (lyd_node *)0x0) {
    iter = *sibling;
    while (iter->prev->next != (lyd_node *)0x0) {
      iter = iter->prev;
    }
  }
  else {
    iter = parent->child;
  }
  if (iter == (lyd_node *)0x0) {
    if (parent == (lyd_node *)0x0) {
      if ((node->parent != (lyd_node *)0x0) || (node->prev->next != (lyd_node *)0x0)) {
        lyd_unlink_internal(node,1);
      }
      node_local->schema = plStack_28;
      return 0;
    }
    par2 = parent->schema;
    if ((par2->nodetype & (LYS_ACTION|LYS_RPC)) != LYS_UNKNOWN) {
      local_94 = LYS_ACTION|LYS_RPC;
    }
  }
  else if ((parent == (lyd_node *)0x0) ||
          ((parent->schema->nodetype & (LYS_ACTION|LYS_RPC)) == LYS_UNKNOWN)) {
    par2 = lys_parent(iter->schema);
    while( true ) {
      bVar5 = false;
      if (par2 != (lys_node *)0x0) {
        bVar5 = (par2->nodetype & (LYS_OUTPUT|LYS_INPUT|LYS_NOTIF|LYS_LIST|LYS_CONTAINER)) ==
                LYS_UNKNOWN;
      }
      if (!bVar5) break;
      par2 = lys_parent(par2);
    }
  }
  else {
    par2 = parent->schema;
    local_94 = LYS_ACTION|LYS_RPC;
  }
  siter = lys_parent(((lyd_node *)plStack_28)->schema);
  while( true ) {
    bVar5 = false;
    if (siter != (lys_node *)0x0) {
      bVar5 = (siter->nodetype & (local_94 | (LYS_NOTIF|LYS_LIST|LYS_CONTAINER))) == LYS_UNKNOWN;
    }
    if (!bVar5) break;
    siter = lys_parent(siter);
  }
  if (par2 == siter) {
    if ((par1._4_4_ != 0) &&
       (((local_78 = lyp_is_rpc_action(((lyd_node *)plStack_28)->schema),
         sibling_local == (lyd_node **)0x0 ||
         (((lyd_node *)plStack_28)->parent != (lyd_node *)sibling_local)) ||
        (clrdflt = local_78, local_78 != 0)))) {
      clrdflt = local_78 + 1;
    }
    if ((((lyd_node *)plStack_28)->parent != (lyd_node *)0x0) ||
       (((lyd_node *)plStack_28)->prev->next != (lyd_node *)0x0)) {
      lyd_unlink_internal((lyd_node *)plStack_28,clrdflt);
    }
    plStack_88 = ly_set_new();
    next1 = (lyd_node *)plStack_28;
    while (next1 != (lyd_node *)0x0) {
      next2 = next1->next;
      if ((clrdflt == 1) &&
         (iVar3 = lyv_multicases(next1,(lys_node *)0x0,&iter,1,(lyd_node *)0x0), iVar3 != 0)) {
        ly_set_free(plStack_88);
        return 1;
      }
      next1->prev = next1;
      next1->next = (lyd_node *)0x0;
      ins = (lyd_node *)0x0;
      if ((next1->field_0x9 & 1) == 0) {
        llists._4_4_ = 1;
      }
      if ((((next1->field_0x9 & 1) == 0) && (next1->schema->nodetype == LYS_LEAF)) &&
         (plVar4 = lys_is_key((lys_node_leaf *)next1->schema,&local_8d),
         plVar4 != (lys_node_list *)0x0)) {
        stype = 0;
        ins = sibling_local[8];
        while( true ) {
          bVar5 = false;
          if ((ins != (lyd_node *)0x0) && (bVar5 = false, stype < (int)(uint)local_8d)) {
            bVar5 = ins->schema->nodetype == LYS_LEAF;
          }
          if (!bVar5) break;
          stype = stype + 1;
          ins = ins->next;
        }
        if (ins != (lyd_node *)0x0) {
          if (sibling_local[8] == ins) {
            sibling_local[8] = next1;
          }
          if (ins->prev->next != (lyd_node *)0x0) {
            ins->prev->next = next1;
          }
          next1->prev = ins->prev;
          ins->prev = next1;
          next1->next = ins;
          if (sibling_local[8] != iter) {
            iter = sibling_local[8];
          }
        }
      }
      else if (next1->schema->nodetype == LYS_LEAFLIST) {
        stype = plStack_88->number;
        iVar3 = ly_set_add(plStack_88,next1->schema,0);
        if ((iVar3 != stype) || ((next1->field_0x9 & 1) != 0)) {
          ins = iter;
          while (ins != (lyd_node *)0x0) {
            _isrpc = ins->next;
            if ((ins->schema == next1->schema) &&
               ((((next1->field_0x9 & 1) != 0 &&
                 (((ins->field_0x9 & 1) == 0 ||
                  (((ins->schema->flags & 1) != 0 &&
                   (iVar3 = strcmp((char *)ins->ht,(char *)next1->ht), iVar3 == 0)))))) ||
                (((next1->field_0x9 & 1) == 0 && ((ins->field_0x9 & 1) != 0)))))) {
              if (ins == iter) {
                iter = _isrpc;
              }
              lyd_free(ins);
            }
            ins = _isrpc;
          }
        }
      }
      else if ((next1->schema->nodetype == LYS_LEAF) ||
              ((next1->schema->nodetype == LYS_CONTAINER &&
               (plVar1 = next1->schema, lVar2._0_2_ = plVar1[1].flags,
               lVar2._2_1_ = plVar1[1].ext_size, lVar2._3_1_ = plVar1[1].iffeature_size,
               lVar2._4_1_ = plVar1[1].padding[0], lVar2._5_1_ = plVar1[1].padding[1],
               lVar2._6_1_ = plVar1[1].padding[2], lVar2._7_1_ = plVar1[1].padding[3], lVar2 == 0)))
              ) {
        for (ins = iter; ins != (lyd_node *)0x0; ins = ins->next) {
          if (ins->schema == next1->schema) {
            if (((next1->field_0x9 & 1) == 0) && ((ins->field_0x9 & 1) == 0)) {
              ins = (lyd_node *)0x0;
            }
            else {
              lyd_replace(ins,next1,1);
            }
            break;
          }
        }
      }
      if (ins == (lyd_node *)0x0) {
        if (iter == (lyd_node *)0x0) {
          iter = next1;
          if (sibling_local != (lyd_node **)0x0) {
            sibling_local[8] = next1;
          }
        }
        else if (local_78 == 0) {
          iter->prev->next = next1;
          next1->prev = iter->prev;
          iter->prev = next1;
        }
        else {
          for (par2 = next1->schema->parent;
              (par2->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN; par2 = lys_parent(par2)) {
          }
          start = (lyd_node *)0x0;
          ins = iter;
LAB_001a14d7:
          if (ins == (lyd_node *)0x0) goto LAB_001a162e;
          do {
            plVar1 = par2;
            last = start;
            module = lys_node_module(par2);
            start = (lyd_node *)lys_getnext((lys_node *)last,plVar1,module,0);
            if (((lys_node *)start == (lys_node *)0x0) || (ins->schema == (lys_node *)start)) break;
          } while (next1->schema != (lys_node *)start);
          if (next1->schema != (lys_node *)start) {
            ins = ins->next;
            goto LAB_001a14d7;
          }
          if (((((lys_node *)start)->nodetype & (LYS_LIST|LYS_LEAFLIST)) == LYS_UNKNOWN) ||
             (ins->schema != (lys_node *)start)) goto LAB_001a15ba;
          while( true ) {
            bVar5 = false;
            if (ins != (lyd_node *)0x0) {
              bVar5 = ins->schema == (lys_node *)start;
            }
            if (!bVar5) break;
            ins = ins->next;
          }
          if (ins != (lyd_node *)0x0) {
LAB_001a15ba:
            if (ins == iter) {
              iter = next1;
              if (sibling_local != (lyd_node **)0x0) {
                sibling_local[8] = next1;
              }
            }
            else {
              ins->prev->next = next1;
            }
            next1->prev = ins->prev;
            ins->prev = next1;
            next1->next = ins;
          }
LAB_001a162e:
          if (ins == (lyd_node *)0x0) {
            iter->prev->next = next1;
            next1->prev = iter->prev;
            iter->prev = next1;
          }
        }
      }
      lyd_unlink_hash(next1,next1->parent);
      next1->parent = (lyd_node *)sibling_local;
      lyd_insert_hash(next1);
      if (par1._4_4_ != 0) {
        check_leaf_list_backlinks(next1,0);
      }
      if (clrdflt != 0) {
        lyd_insert_setinvalid(next1);
      }
      next1 = next2;
    }
    ly_set_free(plStack_88);
    if (llists._4_4_ != 0) {
      ins = (lyd_node *)sibling_local;
      while( true ) {
        bVar5 = false;
        if (ins != (lyd_node *)0x0) {
          bVar5 = (ins->field_0x9 & 1) != 0;
        }
        if (!bVar5) break;
        ins->field_0x9 = ins->field_0x9 & 0xfe;
        ins = ins->parent;
      }
    }
    if (node_local != (lyd_node *)0x0) {
      node_local->schema = (lys_node *)iter;
    }
    parent_local._4_4_ = 0;
  }
  else {
    if (par2 == (lys_node *)0x0) {
      local_a8 = "<top-lvl>";
    }
    else {
      local_a8 = par2->name;
    }
    if (siter == (lys_node *)0x0) {
      local_b8 = "<top-lvl>";
    }
    else {
      local_b8 = siter->name;
    }
    ly_log((ly_ctx *)**(undefined8 **)&(*sibling_local)->hash,LY_LLERR,LY_EINVAL,
           "Cannot insert, different parents (\"%s\" and \"%s\").",local_a8,local_b8);
    parent_local._4_4_ = 1;
  }
  return parent_local._4_4_;
}

Assistant:

int
lyd_insert_common(struct lyd_node *parent, struct lyd_node **sibling, struct lyd_node *node, int invalidate)
{
    struct lys_node *par1, *par2;
    const struct lys_node *siter;
    struct lyd_node *start, *iter, *ins, *next1, *next2;
    int invalid = 0, isrpc = 0, clrdflt = 0;
    struct ly_set *llists = NULL;
    int i;
    uint8_t pos;
    int stype = LYS_INPUT | LYS_OUTPUT;

    assert(parent || sibling);

    /* get first sibling */
    if (parent) {
        start = parent->child;
    } else {
        for (start = *sibling; start->prev->next; start = start->prev);
    }

    /* check placing the node to the appropriate place according to the schema */
    if (!start) {
        if (!parent) {
            /* empty tree to insert */
            if (node->parent || node->prev->next) {
                /* unlink the node first */
                lyd_unlink_internal(node, 1);
            } /* else insert also node's siblings */
            *sibling = node;
            return EXIT_SUCCESS;
        }
        par1 = parent->schema;
        if (par1->nodetype & (LYS_RPC | LYS_ACTION)) {
            /* it is not clear if the tree being created is going to
             * be rpc (LYS_INPUT) or rpc-reply (LYS_OUTPUT) so we have to
             * compare against LYS_RPC or LYS_ACTION in par2
             */
            stype = LYS_RPC | LYS_ACTION;
        }
    } else if (parent && (parent->schema->nodetype & (LYS_RPC | LYS_ACTION))) {
        par1 = parent->schema;
        stype = LYS_RPC | LYS_ACTION;
    } else {
        for (par1 = lys_parent(start->schema);
             par1 && !(par1->nodetype & (LYS_CONTAINER | LYS_LIST | LYS_INPUT | LYS_OUTPUT | LYS_NOTIF));
             par1 = lys_parent(par1));
    }
    for (par2 = lys_parent(node->schema);
         par2 && !(par2->nodetype & (LYS_CONTAINER | LYS_LIST | stype | LYS_NOTIF));
         par2 = lys_parent(par2));
    if (par1 != par2) {
        LOGERR(parent->schema->module->ctx, LY_EINVAL, "Cannot insert, different parents (\"%s\" and \"%s\").",
               (par1 ? par1->name : "<top-lvl>"), (par2 ? par2->name : "<top-lvl>"));
        return EXIT_FAILURE;
    }

    if (invalidate) {
        invalid = isrpc = lyp_is_rpc_action(node->schema);
        if (!parent || node->parent != parent || isrpc) {
            /* it is not just moving under a parent node or it is in an RPC where
             * nodes order matters, so the validation will be necessary */
            invalid++;
        }
    }

    /* unlink only if it is not a list of siblings without a parent and node is not the first sibling */
    if (node->parent || node->prev->next) {
        /* do it permanent if the parents are not exact same or if it is top-level */
        lyd_unlink_internal(node, invalid);
    }

    llists = ly_set_new();

    /* process the nodes to insert one by one */
    LY_TREE_FOR_SAFE(node, next1, ins) {
        if (invalid == 1) {
            /* auto delete nodes from other cases, if any;
             * this is done only if node->parent != parent */
            if (lyv_multicases(ins, NULL, &start, 1, NULL)) {
                goto error;
            }
        }

        /* isolate the node to be handled separately */
        ins->prev = ins;
        ins->next = NULL;

        iter = NULL;
        if (!ins->dflt) {
            clrdflt = 1;
        }

        /* are we inserting list key? */
        if (!ins->dflt && ins->schema->nodetype == LYS_LEAF && lys_is_key((struct lys_node_leaf *)ins->schema, &pos)) {
            /* yes, we have a key, get know its position */
            for (i = 0, iter = parent->child;
                    iter && i < pos && iter->schema->nodetype == LYS_LEAF;
                    i++, iter = iter->next);
            if (iter) {
                /* insert list's key to the correct position - before the iter */
                if (parent->child == iter) {
                    parent->child = ins;
                }
                if (iter->prev->next) {
                    iter->prev->next = ins;
                }
                ins->prev = iter->prev;
                iter->prev = ins;
                ins->next = iter;

                /* update start element */
                if (parent->child != start) {
                    start = parent->child;
                }
            }

            /* try to find previously present default instance to replace */
        } else if (ins->schema->nodetype == LYS_LEAFLIST) {
            i = (int)llists->number;
            if ((ly_set_add(llists, ins->schema, 0) != i) || ins->dflt) {
                /* each leaf-list must be cleared only once (except when looking for exact same existing dflt nodes) */
                LY_TREE_FOR_SAFE(start, next2, iter) {
                    if (iter->schema == ins->schema) {
                        if ((ins->dflt && (!iter->dflt || ((iter->schema->flags & LYS_CONFIG_W) &&
                                                           !strcmp(((struct lyd_node_leaf_list *)iter)->value_str,
                                                                  ((struct lyd_node_leaf_list *)ins)->value_str))))
                                || (!ins->dflt && iter->dflt)) {
                            if (iter == start) {
                                start = next2;
                            }
                            lyd_free(iter);
                        }
                    }
                }
            }
        } else if (ins->schema->nodetype == LYS_LEAF || (ins->schema->nodetype == LYS_CONTAINER
                        && !((struct lys_node_container *)ins->schema)->presence)) {
            LY_TREE_FOR(start, iter) {
                if (iter->schema == ins->schema) {
                    if (ins->dflt || iter->dflt) {
                        /* replace existing (either explicit or default) node with the new (either explicit or default) node */
                        lyd_replace(iter, ins, 1);
                    } else {
                        /* keep both explicit nodes, let the caller solve it later */
                        iter = NULL;
                    }
                    break;
                }
            }
        }

        if (!iter) {
            if (!start) {
                /* add as the only child of the parent */
                start = ins;
                if (parent) {
                    parent->child = ins;
                }
            } else if (isrpc) {
                /* add to the specific position in rpc/rpc-reply/action */
                for (par1 = ins->schema->parent; !(par1->nodetype & (LYS_INPUT | LYS_OUTPUT)); par1 = lys_parent(par1));
                siter = NULL;
                LY_TREE_FOR(start, iter) {
                    while ((siter = lys_getnext(siter, par1, lys_node_module(par1), 0))) {
                        if (iter->schema == siter || ins->schema == siter) {
                            break;
                        }
                    }
                    if (ins->schema == siter) {
                        if ((siter->nodetype & (LYS_LEAFLIST | LYS_LIST)) && iter->schema == siter) {
                            /* we are inserting leaflist/list instance, but since there are already
                             * some instances of the same leaflist/list, we want to insert the new one
                             * as the last instance, so here we have to move on */
                            while (iter && iter->schema == siter) {
                                iter = iter->next;
                            }
                            if (!iter) {
                                break;
                            }
                        }
                        /* we have the correct place for new node (before the iter) */
                        if (iter == start) {
                            start = ins;
                            if (parent) {
                                parent->child = ins;
                            }
                        } else {
                            iter->prev->next = ins;
                        }
                        ins->prev = iter->prev;
                        iter->prev = ins;
                        ins->next = iter;

                        /* we are done */
                        break;
                    }
                }
                if (!iter) {
                    /* add as the last child of the parent */
                    start->prev->next = ins;
                    ins->prev = start->prev;
                    start->prev = ins;
                }
            } else {
                /* add as the last child of the parent */
                start->prev->next = ins;
                ins->prev = start->prev;
                start->prev = ins;
            }
        }

#ifdef LY_ENABLED_CACHE
        lyd_unlink_hash(ins, ins->parent);
#endif

        ins->parent = parent;

#ifdef LY_ENABLED_CACHE
        lyd_insert_hash(ins);
#endif

        if (invalidate) {
            check_leaf_list_backlinks(ins, 0);
        }

        if (invalid) {
            lyd_insert_setinvalid(ins);
        }
    }
    ly_set_free(llists);

    if (clrdflt) {
        /* remove the dflt flag from parents */
        for (iter = parent; iter && iter->dflt; iter = iter->parent) {
            iter->dflt = 0;
        }
    }

    if (sibling) {
        *sibling = start;
    }
    return EXIT_SUCCESS;

error:
    ly_set_free(llists);
    return EXIT_FAILURE;
}